

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O1

duckdb_value duckdb_get_struct_child(duckdb_value value,idx_t index)

{
  vector<duckdb::Value,_true> *this;
  Value *this_00;
  const_reference other;
  Value val;
  Value local_58;
  
  if (value != (duckdb_value)0x0) {
    duckdb::Value::Value(&local_58,(Value *)value);
    if (((local_58.type_.id_ == STRUCT) && (local_58.is_null == false)) &&
       (this = duckdb::StructValue::GetChildren(&local_58),
       index < (ulong)((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 6))) {
      this_00 = (Value *)operator_new(0x40);
      other = duckdb::vector<duckdb::Value,_true>::operator[](this,index);
      duckdb::Value::Value(this_00,other);
    }
    else {
      this_00 = (Value *)0x0;
    }
    duckdb::Value::~Value(&local_58);
    return (duckdb_value)this_00;
  }
  return (duckdb_value)0x0;
}

Assistant:

duckdb_value duckdb_get_struct_child(duckdb_value value, idx_t index) {
	if (!value) {
		return nullptr;
	}

	auto val = UnwrapValue(value);
	if (val.type().id() != LogicalTypeId::STRUCT || val.IsNull()) {
		return nullptr;
	}

	auto &children = duckdb::StructValue::GetChildren(val);
	if (index >= children.size()) {
		return nullptr;
	}

	return WrapValue(new duckdb::Value(children[index]));
}